

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O0

void __thiscall create::Data::Data(Data *this,ProtocolVersion version)

{
  bool bVar1;
  mapped_type *pmVar2;
  pointer ppVar3;
  element_type *peVar4;
  _Self local_350;
  _Self local_348;
  iterator it;
  shared_ptr<create::Packet> local_338;
  key_type local_325;
  char local_324 [4];
  shared_ptr<create::Packet> local_320;
  key_type local_30d;
  char local_30c [4];
  shared_ptr<create::Packet> local_308;
  key_type local_2f5;
  char local_2f4 [4];
  shared_ptr<create::Packet> local_2f0;
  key_type local_2dd;
  char local_2dc [4];
  shared_ptr<create::Packet> local_2d8;
  key_type local_2c5;
  char local_2c4 [4];
  shared_ptr<create::Packet> local_2c0;
  key_type local_2ad;
  char local_2ac [4];
  shared_ptr<create::Packet> local_2a8;
  key_type local_295;
  char local_294 [4];
  shared_ptr<create::Packet> local_290;
  key_type local_27d;
  char local_27c [4];
  shared_ptr<create::Packet> local_278;
  key_type local_265;
  char local_264 [4];
  shared_ptr<create::Packet> local_260;
  key_type local_24d;
  char local_24c [4];
  shared_ptr<create::Packet> local_248;
  key_type local_235;
  char local_234 [4];
  shared_ptr<create::Packet> local_230;
  key_type local_21d;
  char local_21c [4];
  shared_ptr<create::Packet> local_218;
  key_type local_205;
  char local_204 [4];
  shared_ptr<create::Packet> local_200;
  key_type local_1ed;
  char local_1ec [4];
  shared_ptr<create::Packet> local_1e8;
  key_type local_1d5;
  char local_1d4 [4];
  shared_ptr<create::Packet> local_1d0;
  key_type local_1bd;
  char local_1bc [4];
  shared_ptr<create::Packet> local_1b8;
  key_type local_1a5;
  char local_1a4 [4];
  shared_ptr<create::Packet> local_1a0;
  key_type local_18d;
  char local_18c [4];
  shared_ptr<create::Packet> local_188;
  key_type local_175;
  char local_174 [4];
  shared_ptr<create::Packet> local_170;
  key_type local_15d;
  char local_15c [4];
  shared_ptr<create::Packet> local_158;
  key_type local_145;
  char local_144 [4];
  shared_ptr<create::Packet> local_140;
  key_type local_12d;
  char local_12c [4];
  shared_ptr<create::Packet> local_128;
  key_type local_115;
  char local_114 [4];
  shared_ptr<create::Packet> local_110;
  key_type local_fd;
  char local_fc [4];
  shared_ptr<create::Packet> local_f8;
  key_type local_e5;
  char local_e4 [4];
  shared_ptr<create::Packet> local_e0;
  key_type local_cd;
  char local_cc [4];
  shared_ptr<create::Packet> local_c8;
  key_type local_b5;
  char local_b4 [4];
  shared_ptr<create::Packet> local_b0;
  key_type local_9d;
  char local_9c [4];
  shared_ptr<create::Packet> local_98;
  key_type local_85;
  char local_84 [4];
  shared_ptr<create::Packet> local_80;
  key_type local_6d;
  char local_6c [4];
  shared_ptr<create::Packet> local_68;
  key_type local_55;
  char local_54 [4];
  shared_ptr<create::Packet> local_50;
  key_type local_3d [17];
  char local_2c [4];
  shared_ptr<create::Packet> local_28;
  ProtocolVersion local_14;
  Data *pDStack_10;
  ProtocolVersion version_local;
  Data *this_local;
  
  local_14 = version;
  pDStack_10 = this;
  std::
  map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
  ::map(&this->packets);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->ids);
  if (local_14 != ~V_ALL) {
    local_2c[0] = '\x01';
    local_2c[1] = '\0';
    local_2c[2] = '\0';
    local_2c[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[17]>((int *)&local_28,(char (*) [17])local_2c)
    ;
    local_3d[0] = '\a';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,local_3d);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_28);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_28);
  }
  if (local_14 != ~V_ALL) {
    local_54[0] = '\x01';
    local_54[1] = '\0';
    local_54[2] = '\0';
    local_54[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[5]>((int *)&local_50,(char (*) [5])local_54);
    local_55 = '\b';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_55);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_50);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_50);
  }
  if (local_14 != ~V_ALL) {
    local_6c[0] = '\x01';
    local_6c[1] = '\0';
    local_6c[2] = '\0';
    local_6c[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[11]>((int *)&local_68,(char (*) [11])local_6c)
    ;
    local_6d = '\t';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_6d);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_68);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_68);
  }
  if (local_14 != ~V_ALL) {
    local_84[0] = '\x01';
    local_84[1] = '\0';
    local_84[2] = '\0';
    local_84[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[17]>((int *)&local_80,(char (*) [17])local_84)
    ;
    local_85 = '\n';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_85);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_80);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_80);
  }
  if (local_14 != ~V_ALL) {
    local_9c[0] = '\x01';
    local_9c[1] = '\0';
    local_9c[2] = '\0';
    local_9c[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[18]>((int *)&local_98,(char (*) [18])local_9c)
    ;
    local_9d = '\v';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_9d);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_98);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_98);
  }
  if (local_14 != ~V_ALL) {
    local_b4[0] = '\x01';
    local_b4[1] = '\0';
    local_b4[2] = '\0';
    local_b4[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[12]>((int *)&local_b0,(char (*) [12])local_b4)
    ;
    local_b5 = '\f';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_b5);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_b0);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_b0);
  }
  if (local_14 != ~V_ALL) {
    local_cc[0] = '\x01';
    local_cc[1] = '\0';
    local_cc[2] = '\0';
    local_cc[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[13]>((int *)&local_c8,(char (*) [13])local_cc)
    ;
    local_cd = '\r';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_cd);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_c8);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_c8);
  }
  if (local_14 != ~V_ALL) {
    local_e4[0] = '\x01';
    local_e4[1] = '\0';
    local_e4[2] = '\0';
    local_e4[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[13]>((int *)&local_e0,(char (*) [13])local_e4)
    ;
    local_e5 = '\x0e';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_e5);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_e0);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_e0);
  }
  if (local_14 != ~V_ALL) {
    local_fc[0] = '\x01';
    local_fc[1] = '\0';
    local_fc[2] = '\0';
    local_fc[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[17]>((int *)&local_f8,(char (*) [17])local_fc)
    ;
    local_fd = '\x0f';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_fd);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_f8);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_f8);
  }
  if ((local_14 & V_1) != ~V_ALL) {
    local_114[0] = '\x01';
    local_114[1] = '\0';
    local_114[2] = '\0';
    local_114[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[18]>
              ((int *)&local_110,(char (*) [18])local_114);
    local_115 = '\x10';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_115);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_110);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_110);
  }
  if (local_14 != ~V_ALL) {
    local_12c[0] = '\x01';
    local_12c[1] = '\0';
    local_12c[2] = '\0';
    local_12c[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[10]>
              ((int *)&local_128,(char (*) [10])local_12c);
    local_12d = '\x11';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_12d);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_128);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_128);
  }
  if (local_14 != ~V_ALL) {
    local_144[0] = '\x01';
    local_144[1] = '\0';
    local_144[2] = '\0';
    local_144[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[8]>((int *)&local_140,(char (*) [8])local_144)
    ;
    local_145 = '\x12';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_145);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_140);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_140);
  }
  if ((local_14 & (V_2|V_1)) != ~V_ALL) {
    local_15c[0] = '\x02';
    local_15c[1] = '\0';
    local_15c[2] = '\0';
    local_15c[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[9]>((int *)&local_158,(char (*) [9])local_15c)
    ;
    local_15d = '\x13';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_15d);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_158);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_158);
  }
  if ((local_14 & (V_2|V_1)) != ~V_ALL) {
    local_174[0] = '\x02';
    local_174[1] = '\0';
    local_174[2] = '\0';
    local_174[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[6]>((int *)&local_170,(char (*) [6])local_174)
    ;
    local_175 = '\x14';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_175);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_170);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_170);
  }
  if (local_14 != ~V_ALL) {
    local_18c[0] = '\x01';
    local_18c[1] = '\0';
    local_18c[2] = '\0';
    local_18c[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[15]>
              ((int *)&local_188,(char (*) [15])local_18c);
    local_18d = '\x15';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_18d);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_188);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_188);
  }
  if (local_14 != ~V_ALL) {
    local_1a4[0] = '\x02';
    local_1a4[1] = '\0';
    local_1a4[2] = '\0';
    local_1a4[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[8]>((int *)&local_1a0,(char (*) [8])local_1a4)
    ;
    local_1a5 = '\x16';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_1a5);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_1a0);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_1a0);
  }
  if (local_14 != ~V_ALL) {
    local_1bc[0] = '\x02';
    local_1bc[1] = '\0';
    local_1bc[2] = '\0';
    local_1bc[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[8]>((int *)&local_1b8,(char (*) [8])local_1bc)
    ;
    local_1bd = '\x17';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_1bd);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_1b8);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_1b8);
  }
  if (local_14 != ~V_ALL) {
    local_1d4[0] = '\x01';
    local_1d4[1] = '\0';
    local_1d4[2] = '\0';
    local_1d4[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[12]>
              ((int *)&local_1d0,(char (*) [12])local_1d4);
    local_1d5 = '\x18';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_1d5);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_1d0);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_1d0);
  }
  if (local_14 != ~V_ALL) {
    local_1ec[0] = '\x02';
    local_1ec[1] = '\0';
    local_1ec[2] = '\0';
    local_1ec[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[15]>
              ((int *)&local_1e8,(char (*) [15])local_1ec);
    local_1ed = '\x19';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_1ed);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_1e8);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_1e8);
  }
  if (local_14 != ~V_ALL) {
    local_204[0] = '\x02';
    local_204[1] = '\0';
    local_204[2] = '\0';
    local_204[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[17]>
              ((int *)&local_200,(char (*) [17])local_204);
    local_205 = '\x1a';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_205);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_200);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_200);
  }
  if ((local_14 & (V_3|V_2)) != ~V_ALL) {
    local_21c[0] = '\x01';
    local_21c[1] = '\0';
    local_21c[2] = '\0';
    local_21c[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[8]>((int *)&local_218,(char (*) [8])local_21c)
    ;
    local_21d = '#';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_21d);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_218);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_218);
  }
  if ((local_14 & V_3) != ~V_ALL) {
    local_234[0] = '\x02';
    local_234[1] = '\0';
    local_234[2] = '\0';
    local_234[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[16]>
              ((int *)&local_230,(char (*) [16])local_234);
    local_235 = '+';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_235);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_230);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_230);
  }
  if ((local_14 & V_3) != ~V_ALL) {
    local_24c[0] = '\x02';
    local_24c[1] = '\0';
    local_24c[2] = '\0';
    local_24c[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[17]>
              ((int *)&local_248,(char (*) [17])local_24c);
    local_24d = ',';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_24d);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_248);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_248);
  }
  if ((local_14 & V_3) != ~V_ALL) {
    local_264[0] = '\x01';
    local_264[1] = '\0';
    local_264[2] = '\0';
    local_264[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[13]>
              ((int *)&local_260,(char (*) [13])local_264);
    local_265 = '-';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_265);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_260);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_260);
  }
  if ((local_14 & V_3) != ~V_ALL) {
    local_27c[0] = '\x02';
    local_27c[1] = '\0';
    local_27c[2] = '\0';
    local_27c[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[18]>
              ((int *)&local_278,(char (*) [18])local_27c);
    local_27d = '.';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_27d);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_278);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_278);
  }
  if ((local_14 & V_3) != ~V_ALL) {
    local_294[0] = '\x02';
    local_294[1] = '\0';
    local_294[2] = '\0';
    local_294[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[24]>
              ((int *)&local_290,(char (*) [24])local_294);
    local_295 = '/';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_295);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_290);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_290);
  }
  if ((local_14 & V_3) != ~V_ALL) {
    local_2ac[0] = '\x02';
    local_2ac[1] = '\0';
    local_2ac[2] = '\0';
    local_2ac[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[25]>
              ((int *)&local_2a8,(char (*) [25])local_2ac);
    local_2ad = '0';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_2ad);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_2a8);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_2a8);
  }
  if ((local_14 & V_3) != ~V_ALL) {
    local_2c4[0] = '\x02';
    local_2c4[1] = '\0';
    local_2c4[2] = '\0';
    local_2c4[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[26]>
              ((int *)&local_2c0,(char (*) [26])local_2c4);
    local_2c5 = '1';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_2c5);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_2c0);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_2c0);
  }
  if ((local_14 & V_3) != ~V_ALL) {
    local_2dc[0] = '\x02';
    local_2dc[1] = '\0';
    local_2dc[2] = '\0';
    local_2dc[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[25]>
              ((int *)&local_2d8,(char (*) [25])local_2dc);
    local_2dd = '2';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_2dd);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_2d8);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_2d8);
  }
  if ((local_14 & V_3) != ~V_ALL) {
    local_2f4[0] = '\x02';
    local_2f4[1] = '\0';
    local_2f4[2] = '\0';
    local_2f4[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[19]>
              ((int *)&local_2f0,(char (*) [19])local_2f4);
    local_2f5 = '3';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_2f5);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_2f0);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_2f0);
  }
  if ((local_14 & V_3) != ~V_ALL) {
    local_30c[0] = '\x01';
    local_30c[1] = '\0';
    local_30c[2] = '\0';
    local_30c[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[15]>
              ((int *)&local_308,(char (*) [15])local_30c);
    local_30d = '4';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_30d);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_308);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_308);
  }
  if ((local_14 & V_3) != ~V_ALL) {
    local_324[0] = '\x01';
    local_324[1] = '\0';
    local_324[2] = '\0';
    local_324[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[16]>
              ((int *)&local_320,(char (*) [16])local_324);
    local_325 = '5';
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,&local_325);
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_320);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_320);
  }
  if ((local_14 & V_3) != ~V_ALL) {
    it._M_node._4_4_ = 1;
    std::make_shared<create::Packet,int,char_const(&)[7]>
              ((int *)&local_338,(char (*) [7])((long)&it._M_node + 4));
    it._M_node._3_1_ = 0x3a;
    pmVar2 = std::
             map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
             ::operator[](&this->packets,(key_type *)((long)&it._M_node + 3));
    std::shared_ptr<create::Packet>::operator=(pmVar2,&local_338);
    std::shared_ptr<create::Packet>::~shared_ptr(&local_338);
  }
  this->totalDataBytes = 0;
  local_348._M_node =
       (_Base_ptr)
       std::
       map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
       ::begin(&this->packets);
  while( true ) {
    local_350._M_node =
         (_Base_ptr)
         std::
         map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
         ::end(&this->packets);
    bVar1 = std::operator!=(&local_348,&local_350);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>::
             operator->(&local_348);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->ids,&ppVar3->first)
    ;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>::
             operator->(&local_348);
    peVar4 = std::__shared_ptr_access<create::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<create::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&ppVar3->second);
    this->totalDataBytes = (uint)peVar4->nbytes + this->totalDataBytes;
    std::_Rb_tree_iterator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>::
    operator++(&local_348);
  }
  return;
}

Assistant:

Data::Data(ProtocolVersion version) {
    // Populate data map
    /* * * * * * * * * * * * * * * * * * * * * * * * * * * * * * *
     *  WARNING: Adding too many packets will flood the serial   *
     *           buffer and corrupt the stream.                  *
     * * * * * * * * * * * * * * * * * * * * * * * * * * * * * * */
    ADD_PACKET(ID_BUMP_WHEELDROP, 1, "bumps_wheeldrops", V_ALL);
    ADD_PACKET(ID_WALL, 1, "wall", V_ALL);
    ADD_PACKET(ID_CLIFF_LEFT, 1, "cliff_left", V_ALL);
    ADD_PACKET(ID_CLIFF_FRONT_LEFT, 1, "cliff_front_left", V_ALL);
    ADD_PACKET(ID_CLIFF_FRONT_RIGHT, 1, "cliff_front_right", V_ALL);
    ADD_PACKET(ID_CLIFF_RIGHT, 1, "cliff_right", V_ALL);
    ADD_PACKET(ID_VIRTUAL_WALL, 1, "virtual_wall", V_ALL);
    ADD_PACKET(ID_OVERCURRENTS, 1, "overcurrents", V_ALL);
    ADD_PACKET(ID_DIRT_DETECT_LEFT, 1, "dirt_detect_left", V_ALL);
    ADD_PACKET(ID_DIRT_DETECT_RIGHT, 1, "dirt_detect_right", V_1);
    ADD_PACKET(ID_IR_OMNI, 1, "ir_opcode", V_ALL);
    ADD_PACKET(ID_BUTTONS, 1, "buttons", V_ALL);
    ADD_PACKET(ID_DISTANCE, 2, "distance", V_1 | V_2);
    ADD_PACKET(ID_ANGLE, 2, "angle", V_1 | V_2);
    ADD_PACKET(ID_CHARGE_STATE, 1, "charging_state", V_ALL);
    ADD_PACKET(ID_VOLTAGE, 2, "voltage", V_ALL);
    ADD_PACKET(ID_CURRENT, 2, "current", V_ALL);
    ADD_PACKET(ID_TEMP, 1, "temperature", V_ALL);
    ADD_PACKET(ID_CHARGE , 2, "battery_charge", V_ALL);
    ADD_PACKET(ID_CAPACITY, 2, "battery_capacity", V_ALL);
    ADD_PACKET(ID_OI_MODE, 1, "oi_mode", V_2 | V_3);
    ADD_PACKET(ID_LEFT_ENC, 2, "enc_counts_left", V_3);
    ADD_PACKET(ID_RIGHT_ENC, 2, "enc_counts_right", V_3);
    ADD_PACKET(ID_LIGHT, 1, "light_bumper", V_3);
    ADD_PACKET(ID_LIGHT_LEFT, 2, "light_bumper_left", V_3);
    ADD_PACKET(ID_LIGHT_FRONT_LEFT, 2, "light_bumper_front_left", V_3);
    ADD_PACKET(ID_LIGHT_CENTER_LEFT, 2, "light_bumper_center_left", V_3);
    ADD_PACKET(ID_LIGHT_CENTER_RIGHT, 2, "light_bumper_center_right", V_3);
    ADD_PACKET(ID_LIGHT_FRONT_RIGHT, 2, "light_bumper_front_right", V_3);
    ADD_PACKET(ID_LIGHT_RIGHT, 2, "light_bumper_right", V_3);
    ADD_PACKET(ID_IR_LEFT, 1, "ir_opcode_left", V_3);
    ADD_PACKET(ID_IR_RIGHT, 1, "ir_opcode_right", V_3);
    ADD_PACKET(ID_STASIS, 1, "stasis", V_3);

    totalDataBytes = 0;
    for (std::map<uint8_t, std::shared_ptr<Packet> >::iterator it = packets.begin();
         it != packets.end();
         ++it) {
      ids.push_back(it->first);
      totalDataBytes += it->second->nbytes;
    }
  }